

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O3

int lr_grammar::cmp(void *param_1,void *param_2)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *param_2;
  if (*param_1 <= iVar1) {
    iVar2 = (int)CONCAT71((uint7)(uint3)((uint)iVar1 >> 8),1);
    if (*param_1 < iVar1) {
      return iVar2;
    }
    if (*(int *)((long)param_1 + 4) <= *(int *)((long)param_2 + 4)) {
      if (*(int *)((long)param_1 + 4) < *(int *)((long)param_2 + 4)) {
        return iVar2;
      }
      return CONCAT31((int3)((uint)*(int *)((long)param_1 + 8) >> 8),
                      *(int *)((long)param_1 + 8) < *(int *)((long)param_2 + 8));
    }
  }
  return 0;
}

Assistant:

bool Project::operator< (const Project& project)const{

    //this<project为true


    if (elemKey > project.elemKey) return false;
    if (elemKey < project.elemKey) return true;

    //这里说明elemKey相同
    if (expressIndex > project.expressIndex) return false;
    if (expressIndex < project.expressIndex) return true;


    //这里说明expressIndex相同
    if (projectPoint > project.projectPoint) return false;
    if (projectPoint < project.projectPoint) return true;

    //这里就说明两个相等了
    return false;

}